

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall
duckdb_re2::Prog::ConfigurePrefixAccel(Prog *this,string *prefix,bool prefix_foldcase)

{
  undefined8 uVar1;
  unsigned_long *puVar2;
  uint64_t *puVar3;
  char *pcVar4;
  byte in_DL;
  ulong in_RSI;
  long in_RDI;
  string *in_stack_00000280;
  string local_38 [39];
  byte local_11;
  ulong local_10;
  
  local_11 = in_DL & 1;
  *(byte *)(in_RDI + 0x18) = local_11;
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::size();
  *(undefined8 *)(in_RDI + 0x20) = uVar1;
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    if (*(long *)(in_RDI + 0x20) == 1) {
      pcVar4 = (char *)std::__cxx11::string::front();
      *(int *)(in_RDI + 0x28) = (int)*pcVar4;
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::front();
      *(int *)(in_RDI + 0x28) = (int)*pcVar4;
      pcVar4 = (char *)std::__cxx11::string::back();
      *(int *)(in_RDI + 0x2c) = (int)*pcVar4;
    }
  }
  else {
    puVar2 = Catch::clara::std::min<unsigned_long>((unsigned_long *)(in_RDI + 0x20),&kShiftDFAFinal)
    ;
    *(unsigned_long *)(in_RDI + 0x20) = *puVar2;
    std::__cxx11::string::substr((ulong)local_38,local_10);
    puVar3 = BuildShiftDFA(in_stack_00000280);
    *(uint64_t **)(in_RDI + 0x28) = puVar3;
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void Prog::ConfigurePrefixAccel(const std::string& prefix,
                                bool prefix_foldcase) {
  prefix_foldcase_ = prefix_foldcase;
  prefix_size_ = prefix.size();
  if (prefix_foldcase_) {
    // Use PrefixAccel_ShiftDFA().
    // ... and no more than nine bytes of the prefix. (See above for details.)
    prefix_size_ = std::min(prefix_size_, kShiftDFAFinal);
    prefix_dfa_ = BuildShiftDFA(prefix.substr(0, prefix_size_));
  } else if (prefix_size_ != 1) {
    // Use PrefixAccel_FrontAndBack().
    prefix_front_back.prefix_front_ = prefix.front();
	prefix_front_back.prefix_back_ = prefix.back();
  } else {
    // Use memchr(3).
	prefix_front_back.prefix_front_ = prefix.front();
  }
}